

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

int has_available_input_device(cubeb *ctx)

{
  bool bVar1;
  int iVar2;
  cubeb_device_state *pcVar3;
  uint uVar4;
  ulong uVar5;
  cubeb_device_collection devices;
  cubeb_device_collection local_28;
  
  iVar2 = cubeb_enumerate_devices(ctx,CUBEB_DEVICE_TYPE_INPUT,&local_28);
  if (iVar2 == 0) {
    if (local_28.count != 0) {
      pcVar3 = &(local_28.device)->state;
      bVar1 = false;
      uVar4 = 1;
      do {
        bVar1 = (bool)(bVar1 | *pcVar3 == CUBEB_DEVICE_STATE_ENABLED);
        uVar5 = (ulong)uVar4;
        pcVar3 = pcVar3 + 0x16;
        uVar4 = uVar4 + 1;
      } while (uVar5 < local_28.count);
      if (!bVar1) {
        has_available_input_device();
      }
      cubeb_device_collection_destroy(ctx,&local_28);
      return (uint)bVar1;
    }
    has_available_input_device();
  }
  else {
    has_available_input_device();
  }
  return 0;
}

Assistant:

int has_available_input_device(cubeb * ctx)
{
  cubeb_device_collection devices;
  int input_device_available = 0;
  int r;
  /* Bail out early if the host does not have input devices. */
  r = cubeb_enumerate_devices(ctx, CUBEB_DEVICE_TYPE_INPUT, &devices);
  if (r != CUBEB_OK) {
    fprintf(stderr, "error enumerating devices.");
    return 0;
  }

  if (devices.count == 0) {
    fprintf(stderr, "no input device available, skipping test.\n");
    cubeb_device_collection_destroy(ctx, &devices);
    return 0;
  }

  for (uint32_t i = 0; i < devices.count; i++) {
    input_device_available |= (devices.device[i].state ==
                               CUBEB_DEVICE_STATE_ENABLED);
  }

  if (!input_device_available) {
    fprintf(stderr, "there are input devices, but they are not "
        "available, skipping\n");
  }

  cubeb_device_collection_destroy(ctx, &devices);
  return !!input_device_available;
}